

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

QRegion * __thiscall QRegion::operator+=(QRegion *this,QRegion *r)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QRegionPrivate *in_RSI;
  QRegionPrivate *in_RDI;
  QRegionPrivate *unaff_retaddr;
  QRegionPrivate *in_stack_00000008;
  QRegionPrivate *in_stack_00000060;
  QRegionPrivate *in_stack_00000068;
  QRegionPrivate *in_stack_ffffffffffffffd8;
  QRegionPrivate *this_00;
  QRegionPrivate *in_stack_fffffffffffffff8;
  
  this_00 = in_RDI;
  bVar3 = isEmptyHelper((*(QRegionData **)in_RDI)->qt_rgn);
  if (bVar3) {
    in_RDI = (QRegionPrivate *)operator=((QRegion *)in_RDI,(QRegion *)in_stack_ffffffffffffffd8);
  }
  else {
    bVar3 = isEmptyHelper(*(QRegionPrivate **)(*(long *)in_RSI + 8));
    if (((!bVar3) &&
        (lVar1._0_4_ = in_RDI->numRects, lVar1._4_4_ = in_RDI->innerArea,
        lVar2._0_4_ = in_RSI->numRects, lVar2._4_4_ = in_RSI->innerArea, lVar1 != lVar2)) &&
       (bVar3 = QRegionPrivate::contains(in_RDI,in_stack_ffffffffffffffd8), !bVar3)) {
      bVar3 = QRegionPrivate::contains(in_RDI,in_stack_ffffffffffffffd8);
      if (bVar3) {
        in_RDI = (QRegionPrivate *)operator=((QRegion *)in_RDI,(QRegion *)in_stack_ffffffffffffffd8)
        ;
      }
      else {
        bVar3 = QRegionPrivate::canAppend(this_00,in_RSI);
        if (bVar3) {
          detach((QRegion *)in_RDI);
          QRegionPrivate::append(in_stack_00000068,in_stack_00000060);
        }
        else {
          bVar3 = QRegionPrivate::canPrepend(this_00,in_RSI);
          if (bVar3) {
            detach((QRegion *)in_RDI);
            QRegionPrivate::prepend(in_stack_00000068,in_stack_00000060);
          }
          else {
            bVar3 = EqualRegion(in_stack_00000008,unaff_retaddr);
            if (!bVar3) {
              detach((QRegion *)in_RDI);
              UnionRegion(in_stack_fffffffffffffff8,this_00,in_RSI);
            }
          }
        }
      }
    }
  }
  return (QRegion *)in_RDI;
}

Assistant:

QRegion& QRegion::operator+=(const QRegion &r)
{
    if (isEmptyHelper(d->qt_rgn))
        return *this = r;
    if (isEmptyHelper(r.d->qt_rgn))
        return *this;
    if (d == r.d)
        return *this;

    if (d->qt_rgn->contains(*r.d->qt_rgn)) {
        return *this;
    } else if (r.d->qt_rgn->contains(*d->qt_rgn)) {
        return *this = r;
    } else if (d->qt_rgn->canAppend(r.d->qt_rgn)) {
        detach();
        d->qt_rgn->append(r.d->qt_rgn);
        return *this;
    } else if (d->qt_rgn->canPrepend(r.d->qt_rgn)) {
        detach();
        d->qt_rgn->prepend(r.d->qt_rgn);
        return *this;
    } else if (EqualRegion(d->qt_rgn, r.d->qt_rgn)) {
        return *this;
    } else {
        detach();
        UnionRegion(d->qt_rgn, r.d->qt_rgn, *d->qt_rgn);
        return *this;
    }
}